

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::_q_yearClicked(QCalendarWidgetPrivate *this)

{
  long lVar1;
  int iVar2;
  int ay;
  int ax;
  FocusPolicy FVar3;
  QWidget *this_00;
  QWidget *this_01;
  QCoreApplication *pQVar4;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  FocusPolicy in_stack_ffffffffffffffac;
  QWidget *this_02;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  QCalendarWidgetPrivate *pQVar5;
  FocusReason reason;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  this_00 = &q_func(in_RDI)->super_QWidget;
  reason = (FocusReason)((ulong)pQVar5 >> 0x20);
  this_02 = (QWidget *)in_RDI->yearEdit;
  iVar2 = QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  ay = QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_01 = (QWidget *)
            (**(code **)(*(long *)&(in_RDI->yearEdit->super_QAbstractSpinBox).super_QWidget + 0x70))
                      ();
  ax = QSize::width((QSize *)0x51d350);
  QWidget::height((QWidget *)0x51d367);
  QWidget::setGeometry(in_stack_ffffffffffffffc8,ax,ay,iVar2,in_stack_ffffffffffffffb8);
  QWidget::width((QWidget *)0x51d39d);
  QSpacerItem::changeSize
            ((QSpacerItem *)CONCAT44(ax,ay),iVar2,in_stack_ffffffffffffffb8,
             (Policy)((ulong)this_02 >> 0x20),(Policy)this_02);
  QWidget::hide((QWidget *)0x51d3c9);
  FVar3 = QWidget::focusPolicy(this_00);
  in_RDI->oldFocusPolicy = FVar3;
  QWidget::setFocusPolicy(this_02,in_stack_ffffffffffffffac);
  QWidget::show((QWidget *)CONCAT44(ax,ay));
  pQVar4 = QCoreApplication::instance();
  iVar2 = (int)this_00;
  QObject::installEventFilter((QObject *)pQVar4);
  QWidget::raise((QWidget *)in_RDI->yearEdit,iVar2);
  QAbstractSpinBox::selectAll((QAbstractSpinBox *)in_RDI);
  QWidget::setFocus(this_01,reason);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_yearClicked()
{
    Q_Q(QCalendarWidget);
    //show the spinbox on top of the button
    yearEdit->setGeometry(yearButton->x(), yearButton->y(),
                          yearEdit->sizeHint().width(), yearButton->height());
    spaceHolder->changeSize(yearButton->width(), 0);
    yearButton->hide();
    oldFocusPolicy = q->focusPolicy();
    q->setFocusPolicy(Qt::NoFocus);
    yearEdit->show();
    qApp->installEventFilter(q);
    yearEdit->raise();
    yearEdit->selectAll();
    yearEdit->setFocus(Qt::MouseFocusReason);
}